

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

DenselySampledSpectrum * pbrt::Spectra::D(Float temperature,Allocator alloc)

{
  Allocator alloc_00;
  span<const_float> v;
  span<const_float> l;
  size_type index;
  DenselySampledSpectrum *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  PiecewiseLinearSpectrum dpls;
  int i;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  Float M2;
  Float M1;
  Float M;
  Float y;
  Float x;
  BlackbodySpectrum bb;
  Float cct;
  DenselySampledSpectrum *blackbody;
  undefined4 in_stack_fffffffffffffec8;
  Float in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  Allocator AVar5;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  Allocator in_stack_ffffffffffffff10;
  BlackbodySpectrum in_stack_ffffffffffffff18;
  int local_7c;
  PiecewiseLinearSpectrum *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  float fVar6;
  float *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  fVar1 = (in_XMM0_Da * 1.4388) / 1.438;
  if (4000.0 <= fVar1) {
    AVar5.memoryResource = (memory_resource *)in_RDI;
    if (7000.0 < fVar1) {
      in_stack_fffffffffffffee0 = Pow<3>(in_stack_fffffffffffffed4);
      in_stack_fffffffffffffee0 = -2.0064001e+09 / in_stack_fffffffffffffee0;
      fVar2 = Sqr<float>(fVar1);
      fVar1 = in_stack_fffffffffffffee0 + 1.9018e+06 / fVar2 + 247.48001 / fVar1 + 0.23704;
    }
    else {
      in_stack_fffffffffffffee4 = Pow<3>(in_stack_fffffffffffffed4);
      in_stack_fffffffffffffee4 = -4.607e+09 / in_stack_fffffffffffffee4;
      fVar2 = Sqr<float>(fVar1);
      fVar1 = in_stack_fffffffffffffee4 + 2.9678e+06 / fVar2 + 99.11 / fVar1 + 0.244063;
    }
    fVar2 = (fVar1 * -3.0 * fVar1 + fVar1 * 2.87) - 0.275;
    fVar6 = (fVar1 * 0.2562 + 0.0241) - fVar2 * 0.7341;
    fVar3 = ((-1.3515 - fVar1 * 1.7703) + fVar2 * 5.9114) / fVar6;
    fVar4 = ((0.03 - fVar1 * 31.4424) + fVar2 * 30.0717) / fVar6;
    pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
              ((polymorphic_allocator<float> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (size_t)in_stack_fffffffffffffed8,
               (polymorphic_allocator<float> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    for (local_7c = 0; local_7c < 0x6b; local_7c = local_7c + 1) {
      index = (size_type)local_7c;
      in_stack_fffffffffffffed4 =
           (*(float *)(pbrt::(anonymous_namespace)::CIE_S0 + index * 4) +
            *(float *)(pbrt::(anonymous_namespace)::CIE_S1 + index * 4) * fVar3 +
           *(float *)(pbrt::(anonymous_namespace)::CIE_S2 + index * 4) * fVar4) * 0.01;
      in_stack_fffffffffffffed8 =
           (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
           pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                     ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                      &stack0xffffffffffffff90,index);
      *(float *)&(in_stack_fffffffffffffed8->alloc).memoryResource = in_stack_fffffffffffffed4;
    }
    pstd::span<float_const>::span<107ul>
              ((span<const_float> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (float (*) [107])CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    pstd::span<float_const>::
    span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
              ((span<const_float> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    l.n = in_stack_ffffffffffffffd0;
    l.ptr = in_stack_ffffffffffffffc8;
    v.ptr._4_4_ = fVar6;
    v.ptr._0_4_ = fVar3;
    v.n._0_4_ = fVar2;
    v.n._4_4_ = fVar1;
    alloc_00.memoryResource._4_4_ = fVar4;
    alloc_00.memoryResource._0_4_ = in_stack_ffffffffffffffb0;
    PiecewiseLinearSpectrum::PiecewiseLinearSpectrum(in_stack_ffffffffffffffa8,l,v,alloc_00);
    Spectrum::TaggedPointer<pbrt::PiecewiseLinearSpectrum>
              ((Spectrum *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (PiecewiseLinearSpectrum *)
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    DenselySampledSpectrum::DenselySampledSpectrum
              (in_RDI,(Spectrum *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               AVar5);
    PiecewiseLinearSpectrum::~PiecewiseLinearSpectrum
              ((PiecewiseLinearSpectrum *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  }
  else {
    BlackbodySpectrum::BlackbodySpectrum
              ((BlackbodySpectrum *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffecc);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    DenselySampledSpectrum::
    SampleFunction<pbrt::Spectra::D(float,pstd::pmr::polymorphic_allocator<std::byte>)::__0>
              ((anon_class_8_1_3fcf64fe)in_stack_ffffffffffffff18,in_stack_ffffffffffffff0c,
               in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
    AVar5.memoryResource = (memory_resource *)in_RDI;
  }
  return (DenselySampledSpectrum *)AVar5.memoryResource;
}

Assistant:

DenselySampledSpectrum D(Float temperature, Allocator alloc) {
    // Convert temperature to CCT
    Float cct = temperature * 1.4388f / 1.4380f;
    if (cct < 4000) {
        // CIE D ill-defined, use blackbody
        BlackbodySpectrum bb = BlackbodySpectrum(cct);
        DenselySampledSpectrum blackbody = DenselySampledSpectrum::SampleFunction(
            [=](Float lambda) { return bb(lambda); });

        return blackbody;
    }

    // Convert CCT to xy
    Float x;
    if (cct <= 7000)
        x = -4.607f * 1e9f / Pow<3>(cct) + 2.9678f * 1e6f / Sqr(cct) +
            0.09911f * 1e3f / cct + 0.244063f;
    else
        x = -2.0064f * 1e9f / Pow<3>(cct) + 1.9018f * 1e6f / Sqr(cct) +
            0.24748f * 1e3f / cct + 0.23704f;
    Float y = -3 * x * x + 2.870f * x - 0.275f;

    // Interpolate D spectrum
    Float M = 0.0241f + 0.2562f * x - 0.7341f * y;
    Float M1 = (-1.3515f - 1.7703f * x + 5.9114f * y) / M;
    Float M2 = (0.0300f - 31.4424f * x + 30.0717f * y) / M;

    pstd::vector<Float> values(nCIES);
    for (int i = 0; i < nCIES; ++i)
        values[i] = (CIE_S0[i] + CIE_S1[i] * M1 + CIE_S2[i] * M2) * 0.01;

    PiecewiseLinearSpectrum dpls(CIE_S_lambda, values);
    return DenselySampledSpectrum(&dpls, alloc);
}